

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O3

string * __thiscall
common::StringForFeeReason_abi_cxx11_(string *__return_storage_ptr__,common *this,FeeReason reason)

{
  int iVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  undefined4 in_register_00000014;
  long lVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  long in_FS_OFFSET;
  initializer_list<std::pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  allocator_type local_1b6;
  less<FeeReason> local_1b5;
  FeeReason local_1b4 [9];
  pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190;
  pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (StringForFeeReason[abi:cxx11](FeeReason)::fee_reason_strings_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&StringForFeeReason[abi:cxx11](FeeReason)::
                                 fee_reason_strings_abi_cxx11_,this,
                                CONCAT44(in_register_00000014,reason));
    if (iVar1 != 0) {
      local_1b4[8] = 0;
      std::
      pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<FeeReason,_const_char_(&)[5],_true>(&local_190,local_1b4 + 8,(char (*) [5])"None");
      local_1b4[7] = 1;
      std::
      pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<FeeReason,_const_char_(&)[26],_true>
                (&local_168,local_1b4 + 7,(char (*) [26])"Half Target 60% Threshold");
      local_1b4[6] = 2;
      std::
      pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<FeeReason,_const_char_(&)[21],_true>
                (&local_140,local_1b4 + 6,(char (*) [21])"Target 85% Threshold");
      local_1b4[5] = 3;
      std::
      pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<FeeReason,_const_char_(&)[28],_true>
                (&local_118,local_1b4 + 5,(char (*) [28])"Double Target 95% Threshold");
      local_1b4[4] = 4;
      std::
      pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<FeeReason,_const_char_(&)[42],_true>
                (&local_f0,local_1b4 + 4,(char (*) [42])"Conservative Double Target longer horizon")
      ;
      local_1b4[3] = 5;
      std::
      pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<FeeReason,_const_char_(&)[16],_true>
                (&local_c8,local_1b4 + 3,(char (*) [16])"Mempool Min Fee");
      local_1b4[2] = 6;
      std::
      pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<FeeReason,_const_char_(&)[13],_true>
                (&local_a0,local_1b4 + 2,(char (*) [13])"PayTxFee set");
      local_1b4[1] = 7;
      std::
      pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<FeeReason,_const_char_(&)[13],_true>
                (&local_78,local_1b4 + 1,(char (*) [13])"Fallback fee");
      local_1b4[0] = REQUIRED;
      std::
      pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<FeeReason,_const_char_(&)[21],_true>
                (&local_50,local_1b4,(char (*) [21])"Minimum Required Fee");
      __l._M_len = 9;
      __l._M_array = &local_190;
      std::
      map<FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<FeeReason>,_std::allocator<std::pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map(&StringForFeeReason[abi:cxx11](FeeReason)::fee_reason_strings_abi_cxx11_,__l,&local_1b5,
            &local_1b6);
      lVar4 = -0x168;
      paVar5 = &local_50.second.field_2;
      do {
        if (paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar5->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar5->_M_allocated_capacity)[-2],
                          paVar5->_M_allocated_capacity + 1);
        }
        paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar5->_M_allocated_capacity + -5);
        lVar4 = lVar4 + 0x28;
      } while (lVar4 != 0);
      __cxa_atexit(std::
                   map<FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<FeeReason>,_std::allocator<std::pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~map,&StringForFeeReason[abi:cxx11](FeeReason)::fee_reason_strings_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&StringForFeeReason[abi:cxx11](FeeReason)::fee_reason_strings_abi_cxx11_);
    }
  }
  if (StringForFeeReason[abi:cxx11](FeeReason)::fee_reason_strings_abi_cxx11_._M_t._M_impl.
      super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var2 = &StringForFeeReason[abi:cxx11](FeeReason)::fee_reason_strings_abi_cxx11_._M_t._M_impl.
              super__Rb_tree_header._M_header;
    p_Var3 = StringForFeeReason[abi:cxx11](FeeReason)::fee_reason_strings_abi_cxx11_._M_t._M_impl.
             super__Rb_tree_header._M_header._M_parent;
    do {
      iVar1 = (int)this;
      if (iVar1 <= (int)p_Var3[1]._M_color) {
        p_Var2 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < iVar1];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 !=
         &StringForFeeReason[abi:cxx11](FeeReason)::fee_reason_strings_abi_cxx11_._M_t._M_impl.
          super__Rb_tree_header) && ((int)p_Var2[1]._M_color <= iVar1)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,p_Var2[1]._M_parent,
                 (long)&(p_Var2[1]._M_parent)->_M_color + (long)&(p_Var2[1]._M_left)->_M_color);
      goto LAB_00335094;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"Unknown","");
LAB_00335094:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string StringForFeeReason(FeeReason reason)
{
    static const std::map<FeeReason, std::string> fee_reason_strings = {
        {FeeReason::NONE, "None"},
        {FeeReason::HALF_ESTIMATE, "Half Target 60% Threshold"},
        {FeeReason::FULL_ESTIMATE, "Target 85% Threshold"},
        {FeeReason::DOUBLE_ESTIMATE, "Double Target 95% Threshold"},
        {FeeReason::CONSERVATIVE, "Conservative Double Target longer horizon"},
        {FeeReason::MEMPOOL_MIN, "Mempool Min Fee"},
        {FeeReason::PAYTXFEE, "PayTxFee set"},
        {FeeReason::FALLBACK, "Fallback fee"},
        {FeeReason::REQUIRED, "Minimum Required Fee"},
    };
    auto reason_string = fee_reason_strings.find(reason);

    if (reason_string == fee_reason_strings.end()) return "Unknown";

    return reason_string->second;
}